

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportconsole.cpp
# Opt level: O1

void __thiscall trun::ResultsReportConsole::PrintReport(ResultsReportConsole *this)

{
  ResultSummary *pRVar1;
  Config *pCVar2;
  
  PrintSummary(this);
  pRVar1 = ResultSummary::Instance();
  PrintFailures(this,&pRVar1->results);
  pCVar2 = Config::Instance();
  if (pCVar2->printPassSummary == true) {
    pRVar1 = ResultSummary::Instance();
    PrintPasses(this,&pRVar1->results);
    return;
  }
  return;
}

Assistant:

void ResultsReportConsole::PrintReport() {
    PrintSummary();
    PrintFailures(ResultSummary::Instance().Results());
    if (Config::Instance().printPassSummary) {
        PrintPasses(ResultSummary::Instance().Results());
    }
}